

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
* __thiscall
TextBuffer::Layer::primitive_chunks
          (vector<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
           *__return_storage_ptr__,Layer *this)

{
  Point goal_position;
  Point local_28;
  pair<const_char16_t_*,_unsigned_int> local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Point::Point(&local_28);
  goal_position = Point::max();
  local_20.first = (char16_t *)__return_storage_ptr__;
  for_each_chunk_in_range<TextBuffer::Layer::primitive_chunks()::_lambda(TextSlice)_1_>
            (this,local_28,goal_position,(anon_class_8_1_6971b95b *)&local_20,false);
  if ((__return_storage_ptr__->
      super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->
      super__Vector_base<std::pair<const_char16_t_*,_unsigned_int>,_std::allocator<std::pair<const_char16_t_*,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_20.first = L"";
    local_20.second = 0;
    std::
    vector<std::pair<char16_t_const*,unsigned_int>,std::allocator<std::pair<char16_t_const*,unsigned_int>>>
    ::emplace_back<std::pair<char16_t_const*,unsigned_int>>
              ((vector<std::pair<char16_t_const*,unsigned_int>,std::allocator<std::pair<char16_t_const*,unsigned_int>>>
                *)__return_storage_ptr__,&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<pair<const char16_t *, uint32_t>> primitive_chunks() {
    vector<pair<const char16_t *, uint32_t>> result;
    for_each_chunk_in_range(Point(), Point::max(), [&result](TextSlice slice) {
      result.push_back({slice.data(), slice.size()});
      return false;
    });
    if (result.empty()) result.push_back({u"", 0});
    return result;

  }